

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiNavLayer layer_local;
  
  pIVar1 = GImGui;
  GImGui->NavLayer = layer;
  if (layer == ImGuiNavLayer_Main) {
    pIVar2 = ImGui::NavRestoreLastChildNavWindow(pIVar1->NavWindow);
    pIVar1->NavWindow = pIVar2;
  }
  pIVar2 = pIVar1->NavWindow;
  if ((layer == ImGuiNavLayer_Main) && (pIVar2->NavLastIds[0] != 0)) {
    ImGui::SetNavIDWithRectRel(pIVar2->NavLastIds[0],0,0,pIVar2->NavRectRel);
  }
  else {
    ImGui::NavInitWindow(pIVar2,true);
  }
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (layer == 0 && window->NavLastIds[0] != 0)
        ImGui::SetNavIDWithRectRel(window->NavLastIds[0], layer, 0, window->NavRectRel[0]);
    else
        ImGui::NavInitWindow(window, true);
}